

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall RenderTarget::clear(RenderTarget *this)

{
  size_type sVar1;
  reference ppRVar2;
  uint local_14;
  uint i;
  RenderTarget *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                      (&this->objects);
    if (sVar1 <= local_14) break;
    ppRVar2 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                        (&this->objects,(ulong)local_14);
    if (*ppRVar2 != (value_type)0x0) {
      (*(*ppRVar2)->_vptr_Renderable[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<nite::Program,_std::allocator<nite::Program>_>::clear(&this->programs);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::clear(&this->objects);
  return;
}

Assistant:

void clear(){
		for(unsigned i=0; i<objects.size(); i++){
			//objects[i]->~Renderable();
			delete objects[i];
		}
		programs.clear();
		objects.clear();
	}